

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<int,4,1,0,4,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<int,int>,Eigen::Matrix<int,4,1,0,4,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,Eigen::Matrix<int,4,1,0,4,1>const>const>,Eigen::internal::assign_op<int,int>>
               (Matrix<int,_4,_1,_0,_4,_1> *dst,
               CwiseBinaryOp<Eigen::internal::scalar_quotient_op<int,_int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>
               *src,assign_op<int,_int> *func)

{
  evaluator<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>
  func_00;
  Matrix<int,_4,_1,_0,_4,_1> *dstExpr;
  undefined1 local_70 [8];
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  undefined1 local_38 [8];
  SrcEvaluatorType srcEvaluator;
  assign_op<int,_int> *func_local;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<int,_int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>
  *src_local;
  Matrix<int,_4,_1,_0,_4,_1> *dst_local;
  
  srcEvaluator.
  super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<int,_int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_int,_int>
  .m_d.rhsImpl.
  super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>
       = (evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>
          )func;
  evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<int,_int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>_>
  ::evaluator((evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<int,_int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>_>
               *)local_38,src);
  resize_if_allowed<Eigen::Matrix<int,4,1,0,4,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<int,int>,Eigen::Matrix<int,4,1,0,4,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,Eigen::Matrix<int,4,1,0,4,1>const>const>,int,int>
            (dst,src,(assign_op<int,_int> *)
                     srcEvaluator.
                     super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<int,_int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_int,_int>
                     .m_d.rhsImpl.
                     super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>
            );
  evaluator<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>::evaluator
            ((evaluator<Eigen::Matrix<int,_4,_1,_0,_4,_1>_> *)&kernel.m_dstExpr,dst);
  func_00 = srcEvaluator.
            super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<int,_int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_int,_int>
            .m_d.rhsImpl;
  dstExpr = EigenBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>::const_cast_derived
                      ((EigenBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_> *)dst);
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<int,_int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>_>,_Eigen::internal::assign_op<int,_int>,_0>
  ::generic_dense_assignment_kernel
            ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<int,_int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>_>,_Eigen::internal::assign_op<int,_int>,_0>
              *)local_70,(DstEvaluatorType *)&kernel.m_dstExpr,(SrcEvaluatorType *)local_38,
             (assign_op<int,_int> *)
             func_00.
             super_evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>
             ,dstExpr);
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<int,_int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>_>,_Eigen::internal::assign_op<int,_int>,_0>,_1,_2>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<int,_int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>_>,_Eigen::internal::assign_op<int,_int>,_0>
         *)local_70);
  evaluator<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>::~evaluator
            ((evaluator<Eigen::Matrix<int,_4,_1,_0,_4,_1>_> *)&kernel.m_dstExpr);
  evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<int,_int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>_>
  ::~evaluator((evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<int,_int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_const_Eigen::Matrix<int,_4,_1,_0,_4,_1>_>_>_>
                *)local_38);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}